

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

nn_hash_item * nn_hash_get(nn_hash *self,uint32_t key)

{
  ulong uVar1;
  nn_list_item *it;
  nn_list_item *pnVar2;
  uint uVar3;
  nn_hash_item *pnVar4;
  
  uVar3 = (key >> 0x10 ^ key ^ 0x3d) * 9;
  uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
  uVar1 = (ulong)(uVar3 >> 0xf ^ uVar3) % (ulong)self->slots;
  it = nn_list_begin(self->array + uVar1);
  pnVar2 = nn_list_end(self->array + uVar1);
  if (it != pnVar2) {
    do {
      pnVar4 = (nn_hash_item *)&it[-1].prev;
      if (it == (nn_list_item *)0x0) {
        pnVar4 = (nn_hash_item *)0x0;
      }
      if (pnVar4->key == key) {
        return pnVar4;
      }
      it = nn_list_next(self->array + uVar1,it);
      pnVar2 = nn_list_end(self->array + uVar1);
    } while (it != pnVar2);
  }
  return (nn_hash_item *)0x0;
}

Assistant:

struct nn_hash_item *nn_hash_get (struct nn_hash *self, uint32_t key)
{
    uint32_t slot;
    struct nn_list_item *it;
    struct nn_hash_item *item;

    slot = nn_hash_key (key) % self->slots;

    for (it = nn_list_begin (&self->array [slot]);
          it != nn_list_end (&self->array [slot]);
          it = nn_list_next (&self->array [slot], it)) {
        item = nn_cont (it, struct nn_hash_item, list);
        if (item->key == key)
            return item;
    }

    return NULL;
}